

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O1

string * base64_encode_abi_cxx11_
                   (string *__return_storage_ptr__,
                   vector<unsigned_char,_std::allocator<unsigned_char>_> *input)

{
  long lVar1;
  uint uVar2;
  byte *pbVar3;
  array<unsigned_char,_3UL> input_buffer;
  array<unsigned_char,_4UL> output_buffer;
  byte local_30 [4];
  undefined4 local_2c;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  uVar2 = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_30[2] = 0;
  local_30[0] = 0;
  local_30[1] = 0;
  local_2c = 0;
  pbVar3 = (input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pbVar3 != (input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    uVar2 = 0;
    do {
      lVar1 = (long)(int)uVar2;
      uVar2 = uVar2 + 1;
      local_30[lVar1] = *pbVar3;
      if (uVar2 == 3) {
        local_2c._0_2_ = CONCAT11((local_30[0] & 3) << 4 | local_30[1] >> 4,local_30[0] >> 2);
        local_2c._0_3_ = CONCAT12((local_30[1] & 0xf) << 2 | local_30[2] >> 6,(undefined2)local_2c);
        local_2c = CONCAT13(local_30[2],(undefined3)local_2c) & 0x3fffffff;
        lVar1 = 0;
        do {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (__return_storage_ptr__,
                     base64_chars_abi_cxx11_._M_dataplus._M_p[*(byte *)((long)&local_2c + lVar1)]);
          lVar1 = lVar1 + 1;
        } while (lVar1 != 4);
        uVar2 = 0;
      }
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != (input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  if (uVar2 != 0) {
    if (uVar2 < 3) {
      memset(local_30 + uVar2,0,3 - (ulong)uVar2);
    }
    local_2c._0_2_ = CONCAT11((local_30[0] & 3) << 4 | local_30[1] >> 4,local_30[0] >> 2);
    local_2c._0_3_ = CONCAT12((local_30[1] & 0xf) << 2 | local_30[2] >> 6,(undefined2)local_2c);
    local_2c = CONCAT13(local_30[2],(undefined3)local_2c) & 0x3fffffff;
    if (uVar2 + 1 != 0) {
      lVar1 = 0;
      do {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,
                   base64_chars_abi_cxx11_._M_dataplus._M_p[*(byte *)((long)&local_2c + lVar1)]);
        lVar1 = lVar1 + 1;
      } while ((int)(uVar2 + 1) != lVar1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string base64_encode(const std::vector<uint8_t>& input)
{
    std::string encoded;
    std::array<uint8_t, 3> input_buffer {};
    std::array<uint8_t, 4> output_buffer {};

    int i = 0;
    auto it = input.begin();
    while(it != input.end())
    {
        input_buffer[i++] = *(it++);
        if (i == input_buffer.size())
        {
            output_buffer[0] = (input_buffer[0] & 0xfc) >> 2;
            output_buffer[1] = ((input_buffer[0] & 0x03) << 4) + ((input_buffer[1] & 0xf0) >> 4);
            output_buffer[2] = ((input_buffer[1] & 0x0f) << 2) + ((input_buffer[2] & 0xc0) >> 6);
            output_buffer[3] = input_buffer[2] & 0x3f;

            for(uint8_t byte : output_buffer)
                encoded += base64_chars[byte];
            i = 0;
        }
    }

    if (i)
    {
        for(size_t j=i ; j < input_buffer.size() ; ++j)
            input_buffer[j] = 0;

        output_buffer[0] = (input_buffer[0] & 0xfc) >> 2;
        output_buffer[1] = ((input_buffer[0] & 0x03) << 4) + ((input_buffer[1] & 0xf0) >> 4);
        output_buffer[2] = ((input_buffer[1] & 0x0f) << 2) + ((input_buffer[2] & 0xc0) >> 6);
        output_buffer[3] = input_buffer[2] & 0x3f;

        for (size_t j=0 ; j<i+1 ; ++j)
            encoded += base64_chars[output_buffer[j]];
    }

    return encoded;
}